

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label-utils.h
# Opt level: O2

void __thiscall wasm::LabelUtils::LabelManager::LabelManager(LabelManager *this,Function *func)

{
  _Rb_tree_header *p_Var1;
  
  (this->
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  ).
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .replacep = (Expression **)0x0;
  (this->
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  ).
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .stack.usedFixed = 0;
  (this->
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  ).
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
           ).
           super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  (this->
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  ).
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .currModule = (Module *)0x0;
  *(pointer *)
   ((long)&(this->
           super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
           ).
           super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  ).
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .currFunction = (Function *)0x0;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->labels)._M_t._M_impl.super__Rb_tree_header;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->counter = 0;
  Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::
  walkFunction((Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                *)this,func);
  return;
}

Assistant:

LabelManager(Function* func) { walkFunction(func); }